

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O1

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::OptionalFilter::Deserialize(OptionalFilter *this,Deserializer *deserializer)

{
  int iVar1;
  OptionalFilter *this_00;
  pointer pOVar2;
  byte bVar3;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var4;
  unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true> result;
  _Head_base<0UL,_duckdb::OptionalFilter_*,_false> local_40;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_38;
  TableFilter *local_30;
  
  this_00 = (OptionalFilter *)operator_new(0x18);
  local_38._M_head_impl = (TableFilter *)0x0;
  OptionalFilter(this_00,(unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                          *)&local_38);
  local_40._M_head_impl = this_00;
  if (local_38._M_head_impl != (TableFilter *)0x0) {
    (*(local_38._M_head_impl)->_vptr_TableFilter[1])();
  }
  local_38._M_head_impl = (TableFilter *)0x0;
  pOVar2 = unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>::
           operator->((unique_ptr<duckdb::OptionalFilter,_std::default_delete<duckdb::OptionalFilter>,_true>
                       *)&local_40);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"child_filter");
  bVar3 = (byte)iVar1;
  if (bVar3 == 0) {
    _Var4._M_head_impl =
         (pOVar2->child_filter).
         super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
         super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
    (pOVar2->child_filter).
    super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
    super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = (TableFilter *)0x0;
    if (_Var4._M_head_impl == (TableFilter *)0x0) {
      bVar3 = 0;
      goto LAB_005d7a0b;
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      local_30 = (TableFilter *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      TableFilter::Deserialize((TableFilter *)&local_30,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    _Var4._M_head_impl =
         (pOVar2->child_filter).
         super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
         super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
    (pOVar2->child_filter).
    super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
    super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = local_30;
    if (_Var4._M_head_impl == (TableFilter *)0x0) {
      bVar3 = 1;
      goto LAB_005d7a0b;
    }
  }
  (*(_Var4._M_head_impl)->_vptr_TableFilter[1])();
LAB_005d7a0b:
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)bVar3);
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)local_40._M_head_impl;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> OptionalFilter::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<OptionalFilter>(new OptionalFilter());
	deserializer.ReadPropertyWithDefault<unique_ptr<TableFilter>>(200, "child_filter", result->child_filter);
	return std::move(result);
}